

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

SquareMatrix<3> *
pbrt::WhiteBalance(SquareMatrix<3> *__return_storage_ptr__,Point2f srcWhite,Point2f targetWhite)

{
  undefined1 auVar1 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar2 [64];
  undefined1 auVar6 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  ulong in_XMM1_Qb;
  XYZ XVar7;
  XYZ XVar8;
  SquareMatrix<3> LMScorrect;
  XYZ local_88;
  XYZ local_78;
  SquareMatrix<3> local_68;
  SquareMatrix<3> local_44;
  
  XVar7 = XYZ::FromxyY(srcWhite,1.0);
  local_78.Z = XVar7.Z;
  auVar2._0_8_ = XVar7._0_8_;
  auVar2._8_56_ = in_register_00001208;
  local_78._0_8_ = vmovlps_avx(auVar2._0_16_);
  auVar6 = ZEXT856(in_XMM1_Qb);
  XVar7 = XYZ::FromxyY(targetWhite,1.0);
  local_88.Z = XVar7.Z;
  auVar3._0_8_ = XVar7._0_8_;
  auVar3._8_56_ = auVar6;
  local_88._0_8_ = vmovlps_avx(auVar3._0_16_);
  XVar7 = Mul<pbrt::XYZ,3,pbrt::XYZ>((SquareMatrix<3> *)LMSFromXYZ,&local_78);
  auVar4._0_8_ = XVar7._0_8_;
  auVar4._8_56_ = auVar6;
  XVar8 = Mul<pbrt::XYZ,3,pbrt::XYZ>((SquareMatrix<3> *)LMSFromXYZ,&local_88);
  auVar5._0_8_ = XVar8._0_8_;
  auVar5._8_56_ = auVar6;
  auVar1 = vdivps_avx(auVar5._0_16_,auVar4._0_16_);
  SquareMatrix<3>::SquareMatrix(&local_44);
  local_44.m[0][0] = auVar1._0_4_;
  local_44.m[1][1] = (Float)vextractps_avx(auVar1,1);
  local_44.m[2][2] = XVar8.Z / XVar7.Z;
  operator*(&local_68,(SquareMatrix<3> *)XYZFromLMS,&local_44);
  operator*(__return_storage_ptr__,&local_68,(SquareMatrix<3> *)LMSFromXYZ);
  return __return_storage_ptr__;
}

Assistant:

inline SquareMatrix<3> WhiteBalance(Point2f srcWhite, Point2f targetWhite) {
    // Find LMS coefficients for source and target white
    XYZ srcXYZ = XYZ::FromxyY(srcWhite), dstXYZ = XYZ::FromxyY(targetWhite);
    auto srcLMS = LMSFromXYZ * srcXYZ, dstLMS = LMSFromXYZ * dstXYZ;

    // Return white balancing matrix for source and target white
    SquareMatrix<3> LMScorrect = SquareMatrix<3>::Diag(
        dstLMS[0] / srcLMS[0], dstLMS[1] / srcLMS[1], dstLMS[2] / srcLMS[2]);
    return XYZFromLMS * LMScorrect * LMSFromXYZ;
}